

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O3

void __thiscall chrono::ChForce::UpdateState(ChForce *this)

{
  double *__dest;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChBody *this_00;
  element_type *peVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  ChVectorN<double,_4> Qfrot;
  undefined1 local_d0 [16];
  double local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  double dStack_90;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  
  this_00 = this->Body;
  peVar18 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_b0._8_8_ = 0;
  local_b0._0_8_ = DAT_00b689a0;
  local_c0 = DAT_00b689a8;
  if (peVar18 == (element_type *)0x0) {
    local_d0._8_8_ = 0;
    local_d0._0_8_ = VNULL;
  }
  else {
    local_d0._0_8_ = (this->super_ChObj).ChTime;
    local_d0._8_8_ = 0;
    (*peVar18->_vptr_ChFunction[4])();
  }
  peVar18 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar18 != (element_type *)0x0) {
    local_b0._0_8_ = (this->super_ChObj).ChTime;
    local_b0._8_8_ = 0;
    (*peVar18->_vptr_ChFunction[4])();
  }
  peVar18 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar18 != (element_type *)0x0) {
    local_c0 = (this->super_ChObj).ChTime;
    (*peVar18->_vptr_ChFunction[4])();
  }
  if (this->frame == BODY) {
    auVar54 = vunpcklpd_avx(local_d0,local_b0);
    dVar53 = (this->restpos).m_data[2];
    dVar43 = (this->restpos).m_data[1];
    (this->vrelpoint).m_data[0] = auVar54._0_8_ + (this->restpos).m_data[0];
    (this->vrelpoint).m_data[1] = auVar54._8_8_ + dVar43;
    (this->vrelpoint).m_data[2] = local_c0 + dVar53;
    ChBody::Point_Body2World((ChVector<double> *)local_a0,this_00,&this->vrelpoint);
    if ((ChVector<double> *)local_a0 != &this->vpoint) {
      (this->vpoint).m_data[0] = (double)local_a0._0_8_;
      (this->vpoint).m_data[1] = (double)local_a0._8_8_;
      (this->vpoint).m_data[2] = dStack_90;
    }
  }
  else if (this->frame == WORLD) {
    auVar54 = vunpcklpd_avx(local_d0,local_b0);
    dVar53 = (this->restpos).m_data[2];
    dVar43 = (this->restpos).m_data[1];
    (this->vpoint).m_data[0] = auVar54._0_8_ + (this->restpos).m_data[0];
    (this->vpoint).m_data[1] = auVar54._8_8_ + dVar43;
    (this->vpoint).m_data[2] = local_c0 + dVar53;
    ChBody::Point_World2Body((ChVector<double> *)local_a0,this_00,&this->vpoint);
    if ((ChVector<double> *)local_a0 != &this->vrelpoint) {
      (this->vrelpoint).m_data[0] = (double)local_a0._0_8_;
      (this->vrelpoint).m_data[1] = (double)local_a0._8_8_;
      (this->vrelpoint).m_data[2] = dStack_90;
    }
  }
  local_58 = this->mforce;
  dVar53 = (this->super_ChObj).ChTime;
  (*((this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar43 = DAT_00b689a0;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = VNULL;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = DAT_00b689a8;
  peVar18 = (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70 = VNULL;
  local_60 = dVar53;
  if (peVar18 != (element_type *)0x0) {
    local_70 = (this->super_ChObj).ChTime;
    (*peVar18->_vptr_ChFunction[4])();
  }
  peVar18 = (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar53 = dVar43;
  if (peVar18 != (element_type *)0x0) {
    dVar53 = (this->super_ChObj).ChTime;
    (*peVar18->_vptr_ChFunction[4])();
  }
  peVar18 = (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar25 = auVar61;
  if (peVar18 != (element_type *)0x0) {
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (this->super_ChObj).ChTime;
    local_68 = dVar53;
    (*peVar18->_vptr_ChFunction[4])();
    dVar53 = local_68;
  }
  dVar60 = local_60 * local_58;
  if (this->align == BODY_DIR) {
    dVar43 = (this->vreldir).m_data[1];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (this->vreldir).m_data[0];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (this->vreldir).m_data[2];
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar54 = vfmadd231sd_fma(auVar63,auVar45,auVar20);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar61 = vfmadd231sd_fma(auVar70,auVar45,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar20 = vfmadd231sd_fma(auVar56,auVar45,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar61 = vfmadd231sd_fma(auVar61,auVar37,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar5 = vfmadd231sd_fma(auVar54,auVar37,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar20 = vfmadd231sd_fma(auVar20,auVar37,auVar9);
    (this->vdir).m_data[0] = auVar20._0_8_;
    (this->vdir).m_data[1] = auVar61._0_8_;
    (this->vdir).m_data[2] = auVar5._0_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_70;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         dVar53 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar54 = vfmadd231sd_fma(auVar57,auVar64,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         dVar53 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar6 = vfmadd231sd_fma(auVar74,auVar64,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         dVar53 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar7 = vfmadd231sd_fma(auVar71,auVar64,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar8 = vfmadd231sd_fma(auVar54,auVar25,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar6 = vfmadd231sd_fma(auVar6,auVar25,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar25 = vfmadd231sd_fma(auVar7,auVar25,auVar15);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar60 * auVar20._0_8_ + auVar8._0_8_;
    dVar43 = auVar6._0_8_ + dVar60 * auVar61._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar60 * auVar5._0_8_ + auVar25._0_8_;
  }
  else if (this->align == WORLD_DIR) {
    dVar43 = (this->vdir).m_data[1];
    dVar1 = (this->vdir).m_data[0];
    auVar55._8_8_ = dVar1;
    auVar55._0_8_ = dVar1;
    dVar2 = (this->vdir).m_data[2];
    auVar62._8_8_ = dVar2;
    auVar62._0_8_ = dVar2;
    auVar69._0_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar69._8_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar61 = vfmadd231sd_fma(auVar44,auVar55,auVar3);
    auVar54 = vfmadd231pd_fma(auVar69,auVar55,
                              *(undefined1 (*) [16])
                               (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.
                               super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar61 = vfmadd231sd_fma(auVar61,auVar62,auVar4);
    auVar54 = vfmadd231pd_fma(auVar54,auVar62,
                              *(undefined1 (*) [16])
                               ((this_00->super_ChBodyFrame).super_ChFrameMoving<double>.
                                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])(this->vreldir).m_data = auVar54;
    (this->vreldir).m_data[2] = auVar61._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar60 * dVar1 + local_70;
    dVar43 = dVar53 + dVar60 * dVar43;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar25._0_8_ + dVar60 * dVar2;
  }
  dVar53 = auVar54._0_8_;
  (this->force).m_data[0] = dVar53;
  (this->force).m_data[1] = dVar43;
  dVar60 = auVar61._0_8_;
  (this->force).m_data[2] = dVar60;
  auVar38._8_8_ = dVar53;
  auVar38._0_8_ = dVar53;
  auVar31._0_8_ =
       dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar31._8_8_ =
       dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       dVar43 * (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar25 = vfmadd231sd_fma(auVar26,auVar54,auVar16);
  auVar54 = vfmadd132pd_fma(auVar38,auVar31,
                            *(undefined1 (*) [16])
                             (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.
                             super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar32._8_8_ = dVar60;
  auVar32._0_8_ = dVar60;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar61 = vfmadd231sd_fma(auVar25,auVar61,auVar17);
  auVar54 = vfmadd132pd_fma(auVar32,auVar54,
                            *(undefined1 (*) [16])
                             ((this_00->super_ChBodyFrame).super_ChFrameMoving<double>.
                              super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 6));
  *(undefined1 (*) [16])(this->relforce).m_data = auVar54;
  (this->relforce).m_data[2] = auVar61._0_8_;
  if (this->mode == TORQUE) {
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    dVar53 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[0];
    dVar43 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[1];
    dVar60 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[2];
    dVar1 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[3];
    auVar28._0_8_ = dVar53 + dVar53;
    auVar28._8_8_ = dVar43 + dVar43;
    auVar34._0_8_ = dVar60 + dVar60;
    auVar34._8_8_ = dVar1 + dVar1;
    auVar54 = vshufpd_avx(auVar28,auVar28,1);
    auVar41._0_8_ = auVar54._0_8_ ^ 0x8000000000000000;
    auVar41._8_8_ = auVar54._8_8_ ^ 0x8000000000000000;
    auVar48._0_8_ = -auVar34._0_8_;
    auVar48._8_8_ = -auVar34._8_8_;
    auVar54 = vunpcklpd_avx(auVar41,auVar28);
    auVar67._24_8_ = auVar48._0_8_;
    auVar67._16_8_ = auVar48._0_8_;
    auVar67._0_16_ = auVar54;
    auVar24._16_16_ = auVar34;
    auVar24._0_16_ = auVar54;
    auVar54 = vshufpd_avx(auVar48,auVar34,1);
    auVar42._16_16_ = auVar41;
    auVar42._0_16_ = auVar54;
    auVar24 = vshufpd_avx(auVar24,auVar67,0xe);
    auVar68._16_16_ = auVar28;
    auVar68._0_16_ = auVar48;
    auVar30._16_16_ = auVar28;
    auVar30._0_16_ = auVar54;
    dVar53 = (this->relforce).m_data[1];
    auVar51._8_8_ = dVar53;
    auVar51._0_8_ = dVar53;
    auVar51._16_8_ = dVar53;
    auVar51._24_8_ = dVar53;
    dVar53 = (this->relforce).m_data[0];
    auVar19._8_8_ = dVar53;
    auVar19._0_8_ = dVar53;
    auVar19._16_8_ = dVar53;
    auVar19._24_8_ = dVar53;
    auVar24 = vmulpd_avx512vl(auVar24,auVar19);
    auVar54 = vfmadd231pd_fma(auVar24,auVar51,auVar68);
    dVar53 = (this->relforce).m_data[2];
    auVar52._8_8_ = dVar53;
    auVar52._0_8_ = dVar53;
    auVar52._16_8_ = dVar53;
    auVar52._24_8_ = dVar53;
    auVar24 = vshufpd_avx(auVar42,auVar30,2);
    auVar54 = vfmadd231pd_fma(ZEXT1632(auVar54),auVar52,auVar24);
  }
  else {
    if (this->mode != FORCE) {
      return;
    }
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [0] = dVar53;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [1] = dVar43;
    (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array
    [2] = dVar60;
    auVar25 = vshufpd_avx(auVar54,auVar54,1);
    dVar53 = (this->vrelpoint).m_data[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar53;
    dVar43 = (this->vrelpoint).m_data[0];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar43;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = (this->vrelpoint).m_data[1];
    dVar60 = auVar25._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar60 * 0.0;
    auVar20 = vfnmadd231sd_fma(auVar75,auVar54,auVar39);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar53 * dVar60;
    auVar25 = vfmadd231sd_fma(auVar72,auVar54,ZEXT816(0) << 0x40);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar60 * dVar43;
    auVar54 = vfmsub231sd_fma(auVar40,auVar58,auVar54);
    dVar53 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[2];
    dVar43 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[3];
    auVar20 = vfmadd231sd_fma(auVar20,auVar46,auVar61);
    auVar25 = vfnmadd231sd_fma(auVar25,auVar58,auVar61);
    auVar61 = vfmadd231sd_fma(auVar54,auVar61,ZEXT816(0) << 0x40);
    dVar60 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
             rot.m_data[0];
    dVar1 = (this_00->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
            .m_data[1];
    auVar33._0_8_ = dVar53 + dVar53;
    auVar33._8_8_ = dVar43 + dVar43;
    auVar27._0_8_ = dVar60 + dVar60;
    auVar27._8_8_ = dVar1 + dVar1;
    auVar54 = vshufpd_avx(auVar27,auVar27,1);
    auVar47._0_8_ = auVar54._0_8_ ^ 0x8000000000000000;
    auVar47._8_8_ = auVar54._8_8_ ^ 0x8000000000000000;
    auVar59._0_8_ = -auVar33._0_8_;
    auVar59._8_8_ = -auVar33._8_8_;
    auVar54 = vunpcklpd_avx(auVar47,auVar27);
    auVar73._24_8_ = auVar59._0_8_;
    auVar73._16_8_ = auVar59._0_8_;
    auVar76._16_16_ = auVar27;
    auVar76._0_16_ = auVar59;
    auVar73._0_16_ = auVar54;
    auVar65._16_16_ = auVar33;
    auVar65._0_16_ = auVar54;
    auVar54 = vshufpd_avx(auVar59,auVar33,1);
    dVar53 = auVar25._0_8_;
    auVar49._16_16_ = auVar47;
    auVar49._0_16_ = auVar54;
    auVar29._16_16_ = auVar27;
    auVar29._0_16_ = auVar54;
    auVar24 = vshufpd_avx(auVar65,auVar73,0xe);
    auVar19 = vshufpd_avx(auVar49,auVar29,2);
    auVar24 = vsubpd_avx(ZEXT832(0) << 0x40,auVar24);
    uVar36 = auVar20._0_8_;
    auVar66._8_8_ = uVar36;
    auVar66._0_8_ = uVar36;
    auVar66._16_8_ = uVar36;
    auVar66._24_8_ = uVar36;
    auVar19 = vsubpd_avx(ZEXT832(0) << 0x40,auVar19);
    auVar50._0_8_ = dVar53 * auVar24._0_8_;
    auVar50._8_8_ = dVar53 * auVar24._8_8_;
    auVar50._16_8_ = dVar53 * auVar24._16_8_;
    auVar50._24_8_ = dVar53 * auVar24._24_8_;
    auVar24 = vsubpd_avx(ZEXT832(0) << 0x40,auVar76);
    auVar54 = vfmadd231pd_fma(auVar50,auVar66,auVar24);
    uVar36 = auVar61._0_8_;
    auVar35._8_8_ = uVar36;
    auVar35._0_8_ = uVar36;
    auVar35._16_8_ = uVar36;
    auVar35._24_8_ = uVar36;
    auVar54 = vfmadd231pd_fma(ZEXT1632(auVar54),auVar35,auVar19);
  }
  _local_a0 = ZEXT1632(auVar54);
  __dest = (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
           array + 3;
  uVar23 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
  uVar21 = 4;
  if (uVar23 < 4) {
    uVar21 = uVar23;
  }
  if ((uVar23 == 0) || (memcpy(__dest,local_a0,(ulong)(uVar21 * 8)), uVar23 < 4)) {
    uVar22 = (ulong)(uVar21 << 3);
    memcpy((void *)((long)(this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
                          m_storage.m_data.array + uVar22 + 0x18),local_a0 + uVar22,0x20 - uVar22);
  }
  return;
}

Assistant:

void ChForce::UpdateState() {
    ChBody* my_body;
    double modforce;
    ChVector<> vectforce;
    ChVector<> vmotion;
    ChVector<> xyzforce;

    my_body = GetBody();

    // ====== Update the position of point of application

    vmotion = VNULL;
    if (move_x)
        vmotion.x() = move_x->Get_y(ChTime);
    if (move_y)
        vmotion.y() = move_y->Get_y(ChTime);
    if (move_z)
        vmotion.z() = move_z->Get_y(ChTime);

    switch (frame) {
        case WORLD:
            vpoint = Vadd(restpos, vmotion);                // Uw
            vrelpoint = my_body->Point_World2Body(vpoint);  // Uo1 = [A]'(Uw-Xo1)
            break;
        case BODY:
            vrelpoint = Vadd(restpos, vmotion);             // Uo1
            vpoint = my_body->Point_Body2World(vrelpoint);  // Uw = Xo1+[A]Uo1
            break;
    }

    // ====== Update the fm force vector and add fv

    modforce = mforce * modula->Get_y(ChTime);

    vectforce = VNULL;
    xyzforce = VNULL;
    if (f_x)
        xyzforce.x() = f_x->Get_y(ChTime);
    if (f_y)
        xyzforce.y() = f_y->Get_y(ChTime);
    if (f_z)
        xyzforce.z() = f_z->Get_y(ChTime);

    switch (align) {
        case WORLD_DIR:
            vreldir = my_body->TransformDirectionParentToLocal(vdir);
            vectforce = Vmul(vdir, modforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
        case BODY_DIR:
            vdir = my_body->TransformDirectionLocalToParent(vreldir);
            vectforce = Vmul(vdir, modforce);
            xyzforce = my_body->TransformDirectionLocalToParent(xyzforce);
            vectforce = Vadd(vectforce, xyzforce);
            break;
    }

    force = vectforce;                                           // Fw
    relforce = my_body->TransformDirectionParentToLocal(force);  // Fo1 = [A]'Fw

    // ====== Update the Qc lagrangian!

    switch (mode) {
        case FORCE: {
            Qf(0) = force.x();  // pos.lagrangian Qfx
            Qf(1) = force.y();
            Qf(2) = force.z();

            //   Qfrot= (-[A][u][G])'f

            ChStarMatrix33<> Xpos(vrelpoint);
            ChVector<> VQtemp = Xpos.transpose() * relforce; // = [u]'[A]'F,w

            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = -mGl.transpose() * VQtemp.eigen(); // Q = - [Gl]'[u]'[A]'F,w

            Qf.segment(3, 4) = Qfrot;

            break;
        }

        case TORQUE:
            Qf(0) = 0;  // pos.lagrangian Qfx
            Qf(1) = 0;
            Qf(2) = 0;

            // rot.lagangian
            ChGlMatrix34<> mGl(my_body->GetCoord().rot);
            ChVectorN<double, 4> Qfrot = mGl.transpose() * relforce.eigen();

            Qf.segment(3, 4) = Qfrot;

            break;
    }
}